

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iStack.h
# Opt level: O3

iStack<Imaginer::Utils::iRpn::RPNnode> __thiscall
Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>::cut
          (iStack<Imaginer::Utils::iRpn::RPNnode> *this,int start,int end)

{
  long lVar1;
  int iVar2;
  int in_ECX;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined4 in_register_00000034;
  long *plVar6;
  RPNnode *pRVar7;
  long lVar8;
  RPNnode *pRVar9;
  iStack<Imaginer::Utils::iRpn::RPNnode> iVar10;
  int local_24;
  
  plVar6 = (long *)CONCAT44(in_register_00000034,start);
  iStack(this,&local_24);
  iVar3 = *(int *)((long)plVar6 + 0xc);
  iVar2 = iVar3 + 1;
  if (in_ECX <= iVar3) {
    iVar2 = in_ECX;
  }
  if (end < iVar2) {
    pRVar7 = this->_data;
    lVar5 = (long)iVar2 - (long)end;
    lVar4 = (long)end << 4;
    do {
      lVar1 = *plVar6;
      lVar8 = (long)this->_top + 1;
      this->_top = (int)lVar8;
      pRVar9 = pRVar7 + lVar8;
      if ((RPNnode *)(lVar1 + lVar4) != pRVar9) {
        pRVar9->_node = *(anon_union_8_2_93b31755_for__node *)(lVar1 + lVar4);
        pRVar9->_is = *(bool *)(lVar1 + 8 + lVar4);
        pRVar7 = this->_data;
      }
      lVar4 = lVar4 + 0x10;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    iVar3 = *(int *)((long)plVar6 + 0xc);
    end = iVar2;
  }
  iVar10._8_8_ = (long)end * 0x10;
  *plVar6 = *plVar6 + iVar10._8_8_;
  *(int *)((long)plVar6 + 0xc) = iVar3 - end;
  iVar10._data = (RPNnode *)this;
  return iVar10;
}

Assistant:

iStack<Type>  cut(int start = 0,int end = 1024)
    {
        iStack<Type> rt;
        (end > size())?(end = size()+1):(end);
        int i = start;
        while(i < end)
        {
            rt.push(_data[i++]);
        }
        _data = _data+i;
        _top-=i;
        return rt;
    }